

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_geom_node_list(REF_GRID ref_grid,REF_LIST ref_list)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell_b;
  REF_CELL ref_cell_a;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_INT node;
  REF_INT edgeids [2];
  REF_INT nedgeid;
  REF_INT faceids [3];
  REF_INT nfaceid;
  REF_CELL edg;
  REF_CELL tri;
  REF_CELL qua;
  REF_NODE ref_node;
  REF_LIST ref_list_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  ref_cell_b = ref_grid->cell[6];
  ref_cell_a = ref_grid->cell[3];
  unique0x00012000 = ref_grid->cell[0];
  ref_private_macro_code_rxs_1 = 0;
  do {
    if (pRVar1->max <= ref_private_macro_code_rxs_1) {
      return 0;
    }
    if ((((-1 < ref_private_macro_code_rxs_1) && (ref_private_macro_code_rxs_1 < pRVar1->max)) &&
        (-1 < pRVar1->global[ref_private_macro_code_rxs_1])) &&
       (pRVar1->ref_mpi->id == pRVar1->part[ref_private_macro_code_rxs_1])) {
      uVar2 = ref_cell_id_list_around
                        (stack0xffffffffffffffc0,ref_private_macro_code_rxs_1,2,edgeids,
                         &ref_private_macro_code_rxs);
      if ((uVar2 != 0) && (uVar2 != 7)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x3cf,"ref_interp_geom_node_list",(ulong)uVar2,"count faceids");
        return uVar2;
      }
      uVar2 = ref_cell_id_list_around_both
                        (ref_cell_a,ref_cell_b,ref_private_macro_code_rxs_1,3,faceids + 1,
                         edgeids + 1);
      if ((uVar2 != 0) && (uVar2 != 7)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x3d1,"ref_interp_geom_node_list",(ulong)uVar2,"count faceids");
        return uVar2;
      }
      if (((2 < faceids[1]) || (1 < edgeids[0])) &&
         (uVar2 = ref_list_push(ref_list,ref_private_macro_code_rxs_1), uVar2 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x3d3,"ref_interp_geom_node_list",(ulong)uVar2,"add geom node");
        return uVar2;
      }
    }
    ref_private_macro_code_rxs_1 = ref_private_macro_code_rxs_1 + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_interp_geom_node_list(REF_GRID ref_grid,
                                                    REF_LIST ref_list) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL qua = ref_grid_qua(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_CELL edg = ref_grid_edg(ref_grid);
  REF_INT nfaceid, faceids[3];
  REF_INT nedgeid, edgeids[2];
  REF_INT node;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RXS(ref_cell_id_list_around(edg, node, 2, &nedgeid, edgeids),
          REF_INCREASE_LIMIT, "count faceids");
      RXS(ref_cell_id_list_around_both(tri, qua, node, 3, &nfaceid, faceids),
          REF_INCREASE_LIMIT, "count faceids");
      if (nfaceid >= 3 || nedgeid >= 2)
        RSS(ref_list_push(ref_list, node), "add geom node");
    }
  }
  return REF_SUCCESS;
}